

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixMapfile(unixFile *pFd,i64 nMap)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  void *pvVar5;
  i64 nReuse;
  char *zFunc;
  long lVar6;
  stat statbuf;
  
  if (0 < pFd->nFetchOut) {
    return 0;
  }
  if ((nMap < 0) &&
     (iVar4 = (*aSyscall[5].pCurrent)((ulong)(uint)pFd->h,&statbuf), nMap = statbuf.st_size,
     iVar4 != 0)) {
    return 0x70a;
  }
  lVar2 = pFd->mmapSize;
  lVar6 = pFd->mmapSizeMax;
  if (nMap < pFd->mmapSizeMax) {
    lVar6 = nMap;
  }
  if (lVar6 == lVar2) {
    return 0;
  }
  uVar1 = pFd->h;
  pvVar3 = pFd->pMapRegion;
  if (pvVar3 == (void *)0x0) {
    zFunc = "mmap";
  }
  else {
    if (pFd->mmapSizeActual != lVar2) {
      (*aSyscall[0x17].pCurrent)(lVar2 + (long)pvVar3);
    }
    pvVar5 = (void *)(*aSyscall[0x18].pCurrent)(pvVar3,lVar2,lVar6,1);
    if (1 < (long)pvVar5 + 1U) {
      zFunc = "mremap";
      goto LAB_0021f703;
    }
    (*aSyscall[0x17].pCurrent)(pvVar3,lVar2);
    zFunc = "mremap";
    if (pvVar5 != (void *)0x0) goto LAB_0021f703;
  }
  pvVar5 = (void *)(*aSyscall[0x16].pCurrent)(0,lVar6,1,1,(ulong)uVar1,0);
LAB_0021f703:
  if (pvVar5 == (void *)0xffffffffffffffff) {
    pvVar5 = (void *)0x0;
    unixLogErrorAtLine(0,zFunc,pFd->zPath,0x8993);
    pFd->mmapSizeMax = 0;
    lVar6 = 0;
  }
  pFd->pMapRegion = pvVar5;
  pFd->mmapSizeActual = lVar6;
  pFd->mmapSize = lVar6;
  return 0;
}

Assistant:

static int unixMapfile(unixFile *pFd, i64 nMap){
  assert( nMap>=0 || pFd->nFetchOut==0 );
  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( pFd->nFetchOut>0 ) return SQLITE_OK;

  if( nMap<0 ){
    struct stat statbuf;          /* Low-level file information */
    if( osFstat(pFd->h, &statbuf) ){
      return SQLITE_IOERR_FSTAT;
    }
    nMap = statbuf.st_size;
  }
  if( nMap>pFd->mmapSizeMax ){
    nMap = pFd->mmapSizeMax;
  }

  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( nMap!=pFd->mmapSize ){
    unixRemapfile(pFd, nMap);
  }

  return SQLITE_OK;
}